

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O3

void __thiscall
TTD::ScriptContextTTD::GetFromAsyncPendingList
          (ScriptContextTTD *this,TTDPendingAsyncBufferModification *pendingInfo,byte *finalModPos)

{
  List<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  uint32 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  Type *pTVar5;
  ArrayBuffer *pAVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte *pbVar7;
  byte *pbVar8;
  int index;
  int local_34;
  
  pendingInfo->ArrayBufferVar = (Var)0x0;
  pendingInfo->Index = 0;
  if (0 < (this->m_ttdPendingAsyncModList).
          super_ReadOnlyList<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_DefaultComparer>
          .count) {
    this_00 = &this->m_ttdPendingAsyncModList;
    pbVar8 = (byte *)0x0;
    local_34 = -1;
    index = 0;
    do {
      pTVar5 = JsUtil::
               List<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_00,index);
      pAVar6 = Js::VarTo<Js::ArrayBuffer>(pTVar5->ArrayBufferVar);
      iVar3 = (*(pAVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(pAVar6);
      pbVar7 = (byte *)((ulong)pTVar5->Index + CONCAT44(extraout_var,iVar3));
      iVar3 = (*(pAVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(pAVar6);
      uVar4 = (*(pAVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x71])(pAVar6);
      if ((pbVar7 <= finalModPos) &&
         (finalModPos <= (byte *)(CONCAT44(extraout_var_00,iVar3) + (ulong)uVar4))) {
        if (pbVar8 == finalModPos) {
          TTDAbort_unrecoverable_error("We have something strange!!!");
        }
        if (finalModPos < pbVar8 || pbVar8 == (byte *)0x0) {
          pbVar8 = pbVar7;
          local_34 = index;
        }
      }
      index = index + 1;
    } while (index < (this->m_ttdPendingAsyncModList).
                     super_ReadOnlyList<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_DefaultComparer>
                     .count);
    if (local_34 != -1) {
      pTVar5 = JsUtil::
               List<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_00,local_34);
      uVar1 = pTVar5->Index;
      uVar2 = *(undefined4 *)&pTVar5->field_0xc;
      pendingInfo->ArrayBufferVar = pTVar5->ArrayBufferVar;
      pendingInfo->Index = uVar1;
      *(undefined4 *)&pendingInfo->field_0xc = uVar2;
      Js::
      CopyRemovePolicy<JsUtil::List<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
      ::RemoveAt((CopyRemovePolicy<JsUtil::List<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
                  *)&(this->m_ttdPendingAsyncModList).field_0x28,this_00,local_34);
      return;
    }
  }
  TTDAbort_unrecoverable_error("Missing matching register!!!");
}

Assistant:

void ScriptContextTTD::GetFromAsyncPendingList(TTDPendingAsyncBufferModification* pendingInfo, byte* finalModPos)
    {
        pendingInfo->ArrayBufferVar = nullptr;
        pendingInfo->Index = 0;

        const byte* currentBegin = nullptr;
        int32 pos = -1;
        for(int32 i = 0; i < this->m_ttdPendingAsyncModList.Count(); ++i)
        {
            const TTDPendingAsyncBufferModification& pi = this->m_ttdPendingAsyncModList.Item(i);
            const Js::ArrayBuffer* pbuff = Js::VarTo<Js::ArrayBuffer>(pi.ArrayBufferVar);
            const byte* pbuffBegin = pbuff->GetBuffer() + pi.Index;
            const byte* pbuffMax = pbuff->GetBuffer() + pbuff->GetByteLength();

            //if the final mod is less than the start of this buffer + index or off then end then this definitely isn't it so skip
            if(pbuffBegin > finalModPos || pbuffMax < finalModPos)
            {
                continue;
            }

            //it is in the right range so now we assume non-overlapping so we see if this pbuffBegin is closer than the current best
            TTDAssert(finalModPos != currentBegin, "We have something strange!!!");
            if(currentBegin == nullptr || finalModPos < currentBegin)
            {
                currentBegin = pbuffBegin;
                pos = (int32)i;
            }
        }
        TTDAssert(pos != -1, "Missing matching register!!!");

        *pendingInfo = this->m_ttdPendingAsyncModList.Item(pos);
        this->m_ttdPendingAsyncModList.RemoveAt(pos);
    }